

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

void MakeRandDeterministicDANGEROUS(uint256 *seed)

{
  RNGState *pRVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  Span<const_std::byte> local_38;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar1 = anon_unknown.dwarf_180f9ca::GetRNGState();
  local_28._M_owns = false;
  local_28._M_device = (mutex_type *)pRVar1;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_38.m_size = 0x20;
  local_38.m_data = (byte *)seed;
  std::optional<ChaCha20>::emplace<Span<std::byte_const>>(&pRVar1->m_deterministic_prng,&local_38);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakeRandDeterministicDANGEROUS(const uint256& seed) noexcept
{
    GetRNGState().MakeDeterministic(seed);
}